

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O3

void __thiscall libtorrent::upnp::on_expire(upnp *this,error_code *ec)

{
  _Rb_tree_header *p_Var1;
  service_type *psVar2;
  time_point tVar3;
  pointer pgVar4;
  _Base_ptr p_Var5;
  pointer pgVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  
  if ((ec->failed_ == false) && (this->m_closing == false)) {
    tVar3 = aux::time_now();
    p_Var5 = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_devices)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      lVar8 = 0x7fffffffffffffff;
      do {
        if (*(byte *)((long)&p_Var5[8]._M_color + 2) == 0) {
          pgVar4 = (this->m_mappings).
                   super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                   .
                   super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pgVar6 = (this->m_mappings).
                   super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                   .
                   super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (0 < (int)((ulong)((long)pgVar6 - (long)pgVar4) >> 3) * 0x38e38e39) {
            lVar7 = *(long *)(p_Var5 + 4);
            lVar10 = 0;
            lVar9 = 0;
            do {
              if (*(long *)(lVar7 + lVar10) != 0x7fffffffffffffff) {
                if (*(long *)(lVar7 + lVar10) <= (long)tVar3.__d.__r) {
                  *(undefined1 *)(lVar7 + 8 + lVar10) = 1;
                  update_map(this,(rootdevice *)(p_Var5 + 1),(port_mapping_t)(int)lVar9);
                  lVar7 = *(long *)(p_Var5 + 4);
                  pgVar4 = (this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           .
                           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pgVar6 = (this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           .
                           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
                if (*(long *)(lVar7 + lVar10) < lVar8) {
                  lVar8 = *(long *)(lVar7 + lVar10);
                }
              }
              lVar9 = lVar9 + 1;
              lVar10 = lVar10 + 0x58;
            } while (lVar9 < (int)((ulong)((long)pgVar6 - (long)pgVar4) >> 3) * 0x38e38e39);
          }
        }
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      if (lVar8 != 0x7fffffffffffffff) {
        if ((this->m_refresh_timer).impl_.implementation_.might_have_pending_waits == true) {
          psVar2 = (this->m_refresh_timer).impl_.service_;
          boost::asio::detail::epoll_reactor::
          cancel_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                    (psVar2->scheduler_,&psVar2->timer_queue_,
                     &(this->m_refresh_timer).impl_.implementation_.timer_data,0xffffffffffffffff);
          (this->m_refresh_timer).impl_.implementation_.might_have_pending_waits = false;
        }
        (this->m_refresh_timer).impl_.implementation_.expiry.__d.__r = lVar8;
        ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::upnp,void>
                  ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                   (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
        local_50._M_f = (offset_in_upnp_to_subr)on_expire;
        local_50._8_8_ = 0;
        local_50._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
        local_50._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_60;
        local_68 = (element_type *)0x0;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        boost::asio::detail::
        deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
        ::
        async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                    *)(this->m_refresh_timer).impl_.service_,
                   &(this->m_refresh_timer).impl_.implementation_,&local_50,
                   &(this->m_refresh_timer).impl_.executor_);
        if (local_50._M_bound_args.
            super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>.
            super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
            super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>
                     .super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
                     super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
        }
      }
    }
  }
  return;
}

Assistant:

void upnp::on_expire(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_expire");
	if (ec) return;

	if (m_closing) return;

	time_point const now = aux::time_now();
	time_point next_expire = max_time();

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;
		for (port_mapping_t m{0}; m < m_mappings.end_index(); ++m)
		{
			if (d.mapping[m].expires == max_time())
				continue;

			if (d.mapping[m].expires <= now)
			{
				d.mapping[m].act = portmap_action::add;
				update_map(d, m);
			}
			if (d.mapping[m].expires < next_expire)
			{
				next_expire = d.mapping[m].expires;
			}
		}
	}
	if (next_expire != max_time())
	{
		ADD_OUTSTANDING_ASYNC("upnp::on_expire");
		m_refresh_timer.expires_at(next_expire);
		m_refresh_timer.async_wait(std::bind(&upnp::on_expire, self(), _1));
	}
}